

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_enc.c
# Opt level: O2

int WebPWritePNG(FILE *out_file,WebPDecBuffer *buffer)

{
  int iVar1;
  int iVar2;
  __jmp_buf_tag *__env;
  uint uVar3;
  png_infop *pppVar4;
  int iVar5;
  char cVar6;
  bool bVar7;
  png_structp png;
  png_infop info;
  png_bytep row;
  
  iVar2 = 0;
  if (buffer != (WebPDecBuffer *)0x0 && out_file != (FILE *)0x0) {
    iVar2 = 0;
    png = (png_structp)png_create_write_struct("1.6.37",0,PNGErrorFunction);
    if (png != (png_structp)0x0) {
      info = (png_infop)png_create_info_struct(png);
      if (info == (png_infop)0x0) {
        pppVar4 = (png_infop *)0x0;
        iVar2 = 0;
      }
      else {
        __env = (__jmp_buf_tag *)png_set_longjmp_fn(png,longjmp,200);
        iVar2 = _setjmp(__env);
        if (iVar2 != 0) {
          png_destroy_write_struct(&png,&info);
          return 0;
        }
        png_init_io(png,out_file);
        iVar5 = buffer->height;
        row = (buffer->u).RGBA.rgba;
        uVar3 = buffer->colorspace - MODE_RGBA;
        if ((uVar3 < 0xc) && ((0x81dU >> (uVar3 & 0x1f) & 1) != 0)) {
          cVar6 = '\x06';
        }
        else {
          cVar6 = (0xfffffffb < buffer->colorspace - MODE_YUV) * '\x04' + '\x02';
        }
        iVar1 = (buffer->u).RGBA.stride;
        png_set_IHDR(png,info,buffer->width,iVar5,8,cVar6,0,0,0);
        png_write_info(png,info);
        iVar2 = 1;
        while (bVar7 = iVar5 != 0, iVar5 = iVar5 + -1, bVar7) {
          png_write_rows(png,&row,1);
          row = row + iVar1;
        }
        pppVar4 = &info;
        png_write_end(png,info);
      }
      png_destroy_write_struct(&png,pppVar4);
    }
  }
  return iVar2;
}

Assistant:

int WebPWritePNG(FILE* out_file, const WebPDecBuffer* const buffer) {
  volatile png_structp png;
  volatile png_infop info;

  if (out_file == NULL || buffer == NULL) return 0;

  png = png_create_write_struct(PNG_LIBPNG_VER_STRING,
                                NULL, PNGErrorFunction, NULL);
  if (png == NULL) {
    return 0;
  }
  info = png_create_info_struct(png);
  if (info == NULL) {
    png_destroy_write_struct((png_structpp)&png, NULL);
    return 0;
  }
  if (setjmp(png_jmpbuf(png))) {
    png_destroy_write_struct((png_structpp)&png, (png_infopp)&info);
    return 0;
  }
  png_init_io(png, out_file);
  {
    const uint32_t width = buffer->width;
    const uint32_t height = buffer->height;
    png_bytep row = buffer->u.RGBA.rgba;
    const int stride = buffer->u.RGBA.stride;
    const int has_alpha = WebPIsAlphaMode(buffer->colorspace);
    uint32_t y;

    png_set_IHDR(png, info, width, height, 8,
                 has_alpha ? PNG_COLOR_TYPE_RGBA : PNG_COLOR_TYPE_RGB,
                 PNG_INTERLACE_NONE, PNG_COMPRESSION_TYPE_DEFAULT,
                 PNG_FILTER_TYPE_DEFAULT);
    png_write_info(png, info);
    for (y = 0; y < height; ++y) {
      png_write_rows(png, &row, 1);
      row += stride;
    }
  }
  png_write_end(png, info);
  png_destroy_write_struct((png_structpp)&png, (png_infopp)&info);
  return 1;
}